

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ToolButton::mouseReleaseEvent(ToolButton *this,QMouseEvent *e)

{
  MouseButton MVar1;
  ToolButtonPrivate *pTVar2;
  socklen_t *in_RCX;
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr;
  int __fd;
  QMouseEvent *e_local;
  ToolButton *this_local;
  
  __fd = (int)e;
  MVar1 = QSinglePointEvent::button((QSinglePointEvent *)e);
  if (MVar1 == LeftButton) {
    pTVar2 = QScopedPointer<QtMWidgets::ToolButtonPrivate,_QScopedPointerDeleter<QtMWidgets::ToolButtonPrivate>_>
             ::operator->(&this->d);
    __addr = extraout_RDX;
    if ((pTVar2->leftButtonPressed & 1U) != 0) {
      pTVar2 = QScopedPointer<QtMWidgets::ToolButtonPrivate,_QScopedPointerDeleter<QtMWidgets::ToolButtonPrivate>_>
               ::operator->(&this->d);
      pTVar2->leftButtonPressed = false;
      pTVar2 = QScopedPointer<QtMWidgets::ToolButtonPrivate,_QScopedPointerDeleter<QtMWidgets::ToolButtonPrivate>_>
               ::operator->(&this->d);
      QAction::trigger(pTVar2->action);
      __addr = extraout_RDX_00;
    }
    QEvent::accept((QEvent *)e,__fd,__addr,in_RCX);
  }
  else {
    QEvent::ignore((QEvent *)e);
  }
  return;
}

Assistant:

void
ToolButton::mouseReleaseEvent( QMouseEvent * e )
{
	if( e->button() == Qt::LeftButton )
	{
		if( d->leftButtonPressed )
		{
			d->leftButtonPressed = false;
			d->action->trigger();
		}

		e->accept();
	}
	else
		e->ignore();
}